

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O1

void __thiscall logging_tests::logging_timer::test_method(logging_timer *this)

{
  long lVar1;
  string prefix;
  string end_msg;
  int iVar2;
  iterator pvVar3;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  _func_int **in_stack_fffffffffffffe08;
  bool in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe11;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  string_view result_prefix;
  string_view *local_1a8;
  undefined **local_1a0;
  undefined1 local_198;
  undefined1 *local_190;
  string_view **local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  undefined **local_178;
  undefined1 local_170;
  undefined1 *local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_160;
  char *local_158;
  char *local_150;
  assertion_result local_148;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> micro_timer;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"tests","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"end_msg","");
  pvVar3 = (iterator)0x1;
  prefix._M_string_length._0_1_ = in_stack_fffffffffffffe10;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe08;
  prefix._M_string_length._1_7_ = in_stack_fffffffffffffe11;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffe18;
  prefix.field_2._8_8_ = in_stack_fffffffffffffe20;
  end_msg._M_string_length = in_stack_fffffffffffffe30;
  end_msg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe28;
  end_msg.field_2._M_allocated_capacity = in_stack_fffffffffffffe38;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffe40;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::Timer
            (&micro_timer,prefix,end_msg,(LogFlags)local_b0,SUB81(local_d0,0));
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  result_prefix._M_len = 0xc;
  result_prefix._M_str = "tests: msg (";
  file.m_end = (iterator)0x53;
  file.m_begin = &stack0xfffffffffffffe38;
  msg.m_end = in_R9;
  msg.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffffe28,msg);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"msg","");
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::LogMsg
            (&local_110,&micro_timer,&local_130);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_f0,&local_110,0,result_prefix._M_len);
  if (result_prefix._M_len == local_f0._M_string_length) {
    if (result_prefix._M_len == 0) {
      local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(result_prefix._M_str,local_f0._M_dataplus._M_p,result_prefix._M_len);
      local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/logging_tests.cpp";
  local_150 = "";
  local_160 = &local_180;
  local_170 = 0;
  local_178 = &PTR__lazy_ostream_013d3d70;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_1a8 = &result_prefix;
  local_188 = &local_1a8;
  local_198 = 0;
  local_1a0 = &PTR__lazy_ostream_013d5970;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_180 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_148,(lazy_ostream *)&stack0xfffffffffffffe08,1,2,REQUIRE,0xecc5a1,
             (size_t)&local_158,0x53,&local_178,"result_prefix",&local_1a0);
  boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>::~Timer(&micro_timer);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(logging_timer)
{
    auto micro_timer = BCLog::Timer<std::chrono::microseconds>("tests", "end_msg");
    const std::string_view result_prefix{"tests: msg ("};
    BOOST_CHECK_EQUAL(micro_timer.LogMsg("msg").substr(0, result_prefix.size()), result_prefix);
}